

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationSymbolOccurrence::IfcAnnotationSymbolOccurrence
          (IfcAnnotationSymbolOccurrence *this,void **vtt)

{
  void *pvVar1;
  
  IfcStyledItem::IfcStyledItem((IfcStyledItem *)this,vtt + 2);
  pvVar1 = vtt[0xb];
  *(void **)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x70 = pvVar1;
  *(void **)(&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x70 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0xc];
  pvVar1 = vtt[1];
  *(void **)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem = pvVar1;
  *(void **)(&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x0 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0xd];
  (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0xe];
  *(void **)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x70 = vtt[0xf];
  pvVar1 = vtt[0x10];
  *(void **)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80 = pvVar1;
  *(void **)(&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x11];
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem = pvVar1;
  *(void **)(&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x0 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x12];
  (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x13];
  *(void **)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x70 = vtt[0x14];
  *(void **)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80 = vtt[0x15];
  return;
}

Assistant:

IfcAnnotationSymbolOccurrence() : Object("IfcAnnotationSymbolOccurrence") {}